

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeUtils.h
# Opt level: O0

void TimeUtils::addOffset(timespec *t,int msecs)

{
  int msecs_local;
  timespec *t_local;
  
  t->tv_sec = (long)(msecs / 1000) + t->tv_sec;
  t->tv_nsec = (long)((msecs % 1000) * 1000000) + t->tv_nsec;
  if (t->tv_nsec < 1000000000) {
    if (t->tv_nsec < 0) {
      t->tv_sec = t->tv_sec + -1;
      t->tv_nsec = t->tv_nsec + 1000000000;
    }
  }
  else {
    t->tv_sec = t->tv_sec + 1;
    t->tv_nsec = t->tv_nsec + -1000000000;
  }
  return;
}

Assistant:

inline void addOffset( struct timespec *t, int msecs )
	{
		t->tv_sec += msecs / 1000;
		t->tv_nsec += (msecs % 1000) * 1000000;

		if (t->tv_nsec >= 1000000000)
		{
			t->tv_sec++;
			t->tv_nsec -= 1000000000;
		}
		else if (t->tv_nsec < 0)
		{
			t->tv_sec--;
			t->tv_nsec += 1000000000;
		}
	}